

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_soft.c
# Opt level: O0

void shader_texture_solid_any_step(uintptr_t state,int minor)

{
  state_texture_solid_any_2d *s;
  int minor_local;
  uintptr_t state_local;
  
  if (minor == 0) {
    *(double *)(state + 0x30) = *(double *)(state + 0x50) + *(double *)(state + 0x30);
    *(double *)(state + 0x38) = *(double *)(state + 0x58) + *(double *)(state + 0x38);
  }
  else {
    *(double *)(state + 0x30) = *(double *)(state + 0x40) + *(double *)(state + 0x30);
    *(double *)(state + 0x38) = *(double *)(state + 0x48) + *(double *)(state + 0x38);
  }
  return;
}

Assistant:

static void shader_texture_solid_any_step(uintptr_t state, int minor)
{
   state_texture_solid_any_2d* s = (state_texture_solid_any_2d*)state;
   if (minor) {
      s->u += s->minor_du;
      s->v += s->minor_dv;
   } else {
      s->u += s->major_du;
      s->v += s->major_dv;
   }
}